

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16781328,_false,_embree::sse42::VirtualCurveIntersectorK<4>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  int iVar14;
  int iVar15;
  float fVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  char cVar21;
  AABBNodeMB4D *node1;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  undefined4 uVar27;
  ulong unaff_RBP;
  undefined4 uVar28;
  ulong uVar29;
  size_t sVar30;
  NodeRef *pNVar31;
  NodeRef *pNVar32;
  ulong uVar33;
  ulong uVar34;
  float fVar40;
  float fVar41;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar42;
  undefined1 auVar39 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  vint4 ai_3;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar60;
  float fVar61;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar62;
  float fVar65;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  vint4 ai;
  undefined1 auVar72 [16];
  vint4 bi;
  float fVar73;
  float fVar74;
  float fVar75;
  vint4 ai_1;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  NodeRef stack [244];
  
  stack[0] = root;
  fVar5 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar6 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar7 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar8 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fVar9 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar10 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar11 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar12 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar13 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar14 = (tray->tnear).field_0.i[k];
  iVar15 = (tray->tfar).field_0.i[k];
  pNVar32 = stack + 1;
  do {
    pNVar31 = pNVar32;
    if (pNVar31 == stack) break;
    pNVar32 = pNVar31 + -1;
    sVar30 = pNVar31[-1].ptr;
    do {
      if ((sVar30 & 8) == 0) {
        fVar16 = *(float *)(ray + k * 4 + 0x70);
        uVar24 = (uint)sVar30 & 7;
        uVar22 = sVar30 & 0xfffffffffffffff0;
        uVar28 = (undefined4)(unaff_RBP >> 0x20);
        if (uVar24 == 3) {
          fVar67 = 1.0 - fVar16;
          fVar68 = fVar67 * 0.0;
          auVar58._0_4_ =
               fVar8 * *(float *)(uVar22 + 0x20) +
               fVar9 * *(float *)(uVar22 + 0x50) + fVar10 * *(float *)(uVar22 + 0x80);
          auVar58._4_4_ =
               fVar8 * *(float *)(uVar22 + 0x24) +
               fVar9 * *(float *)(uVar22 + 0x54) + fVar10 * *(float *)(uVar22 + 0x84);
          auVar58._8_4_ =
               fVar8 * *(float *)(uVar22 + 0x28) +
               fVar9 * *(float *)(uVar22 + 0x58) + fVar10 * *(float *)(uVar22 + 0x88);
          auVar58._12_4_ =
               fVar8 * *(float *)(uVar22 + 0x2c) +
               fVar9 * *(float *)(uVar22 + 0x5c) + fVar10 * *(float *)(uVar22 + 0x8c);
          auVar47._0_4_ =
               fVar8 * *(float *)(uVar22 + 0x30) +
               fVar9 * *(float *)(uVar22 + 0x60) + fVar10 * *(float *)(uVar22 + 0x90);
          auVar47._4_4_ =
               fVar8 * *(float *)(uVar22 + 0x34) +
               fVar9 * *(float *)(uVar22 + 100) + fVar10 * *(float *)(uVar22 + 0x94);
          auVar47._8_4_ =
               fVar8 * *(float *)(uVar22 + 0x38) +
               fVar9 * *(float *)(uVar22 + 0x68) + fVar10 * *(float *)(uVar22 + 0x98);
          auVar47._12_4_ =
               fVar8 * *(float *)(uVar22 + 0x3c) +
               fVar9 * *(float *)(uVar22 + 0x6c) + fVar10 * *(float *)(uVar22 + 0x9c);
          auVar53._0_4_ =
               fVar8 * *(float *)(uVar22 + 0x40) +
               fVar9 * *(float *)(uVar22 + 0x70) + fVar10 * *(float *)(uVar22 + 0xa0);
          auVar53._4_4_ =
               fVar8 * *(float *)(uVar22 + 0x44) +
               fVar9 * *(float *)(uVar22 + 0x74) + fVar10 * *(float *)(uVar22 + 0xa4);
          auVar53._8_4_ =
               fVar8 * *(float *)(uVar22 + 0x48) +
               fVar9 * *(float *)(uVar22 + 0x78) + fVar10 * *(float *)(uVar22 + 0xa8);
          auVar53._12_4_ =
               fVar8 * *(float *)(uVar22 + 0x4c) +
               fVar9 * *(float *)(uVar22 + 0x7c) + fVar10 * *(float *)(uVar22 + 0xac);
          fVar77 = (float)DAT_01ff1d40;
          fVar78 = DAT_01ff1d40._4_4_;
          fVar79 = DAT_01ff1d40._8_4_;
          fVar80 = DAT_01ff1d40._12_4_;
          auVar59._4_4_ = -(uint)(ABS(auVar58._4_4_) < fVar78);
          auVar59._0_4_ = -(uint)(ABS(auVar58._0_4_) < fVar77);
          auVar59._8_4_ = -(uint)(ABS(auVar58._8_4_) < fVar79);
          auVar59._12_4_ = -(uint)(ABS(auVar58._12_4_) < fVar80);
          auVar59 = blendvps(auVar58,_DAT_01ff1d40,auVar59);
          auVar37._4_4_ = -(uint)(ABS(auVar47._4_4_) < fVar78);
          auVar37._0_4_ = -(uint)(ABS(auVar47._0_4_) < fVar77);
          auVar37._8_4_ = -(uint)(ABS(auVar47._8_4_) < fVar79);
          auVar37._12_4_ = -(uint)(ABS(auVar47._12_4_) < fVar80);
          auVar56 = blendvps(auVar47,_DAT_01ff1d40,auVar37);
          auVar38._4_4_ = -(uint)(ABS(auVar53._4_4_) < fVar78);
          auVar38._0_4_ = -(uint)(ABS(auVar53._0_4_) < fVar77);
          auVar38._8_4_ = -(uint)(ABS(auVar53._8_4_) < fVar79);
          auVar38._12_4_ = -(uint)(ABS(auVar53._12_4_) < fVar80);
          auVar64 = blendvps(auVar53,_DAT_01ff1d40,auVar38);
          auVar46 = rcpps(auVar38,auVar59);
          fVar77 = auVar46._0_4_;
          fVar80 = auVar46._4_4_;
          fVar65 = auVar46._8_4_;
          fVar66 = auVar46._12_4_;
          fVar77 = (1.0 - auVar59._0_4_ * fVar77) * fVar77 + fVar77;
          fVar80 = (1.0 - auVar59._4_4_ * fVar80) * fVar80 + fVar80;
          fVar65 = (1.0 - auVar59._8_4_ * fVar65) * fVar65 + fVar65;
          fVar66 = (1.0 - auVar59._12_4_ * fVar66) * fVar66 + fVar66;
          auVar46 = rcpps(auVar46,auVar56);
          fVar78 = auVar46._0_4_;
          auVar48._0_4_ = auVar56._0_4_ * fVar78;
          fVar60 = auVar46._4_4_;
          auVar48._4_4_ = auVar56._4_4_ * fVar60;
          fVar61 = auVar46._8_4_;
          auVar48._8_4_ = auVar56._8_4_ * fVar61;
          fVar62 = auVar46._12_4_;
          auVar48._12_4_ = auVar56._12_4_ * fVar62;
          fVar78 = (1.0 - auVar48._0_4_) * fVar78 + fVar78;
          fVar60 = (1.0 - auVar48._4_4_) * fVar60 + fVar60;
          fVar61 = (1.0 - auVar48._8_4_) * fVar61 + fVar61;
          fVar62 = (1.0 - auVar48._12_4_) * fVar62 + fVar62;
          auVar46 = rcpps(auVar48,auVar64);
          fVar79 = auVar46._0_4_;
          fVar40 = auVar46._4_4_;
          fVar41 = auVar46._8_4_;
          fVar42 = auVar46._12_4_;
          fVar79 = (1.0 - auVar64._0_4_ * fVar79) * fVar79 + fVar79;
          fVar40 = (1.0 - auVar64._4_4_ * fVar40) * fVar40 + fVar40;
          fVar41 = (1.0 - auVar64._8_4_ * fVar41) * fVar41 + fVar41;
          fVar42 = (1.0 - auVar64._12_4_ * fVar42) * fVar42 + fVar42;
          fVar81 = *(float *)(uVar22 + 0x20) * fVar5 +
                   *(float *)(uVar22 + 0x50) * fVar6 +
                   *(float *)(uVar22 + 0x80) * fVar7 + *(float *)(uVar22 + 0xb0);
          fVar82 = *(float *)(uVar22 + 0x24) * fVar5 +
                   *(float *)(uVar22 + 0x54) * fVar6 +
                   *(float *)(uVar22 + 0x84) * fVar7 + *(float *)(uVar22 + 0xb4);
          fVar83 = *(float *)(uVar22 + 0x28) * fVar5 +
                   *(float *)(uVar22 + 0x58) * fVar6 +
                   *(float *)(uVar22 + 0x88) * fVar7 + *(float *)(uVar22 + 0xb8);
          fVar84 = *(float *)(uVar22 + 0x2c) * fVar5 +
                   *(float *)(uVar22 + 0x5c) * fVar6 +
                   *(float *)(uVar22 + 0x8c) * fVar7 + *(float *)(uVar22 + 0xbc);
          fVar85 = *(float *)(uVar22 + 0x30) * fVar5 +
                   *(float *)(uVar22 + 0x60) * fVar6 +
                   *(float *)(uVar22 + 0x90) * fVar7 + *(float *)(uVar22 + 0xc0);
          fVar86 = *(float *)(uVar22 + 0x34) * fVar5 +
                   *(float *)(uVar22 + 100) * fVar6 +
                   *(float *)(uVar22 + 0x94) * fVar7 + *(float *)(uVar22 + 0xc4);
          fVar87 = *(float *)(uVar22 + 0x38) * fVar5 +
                   *(float *)(uVar22 + 0x68) * fVar6 +
                   *(float *)(uVar22 + 0x98) * fVar7 + *(float *)(uVar22 + 200);
          fVar88 = *(float *)(uVar22 + 0x3c) * fVar5 +
                   *(float *)(uVar22 + 0x6c) * fVar6 +
                   *(float *)(uVar22 + 0x9c) * fVar7 + *(float *)(uVar22 + 0xcc);
          fVar89 = *(float *)(uVar22 + 0x40) * fVar5 +
                   *(float *)(uVar22 + 0x70) * fVar6 +
                   *(float *)(uVar22 + 0xa0) * fVar7 + *(float *)(uVar22 + 0xd0);
          fVar90 = *(float *)(uVar22 + 0x44) * fVar5 +
                   *(float *)(uVar22 + 0x74) * fVar6 +
                   *(float *)(uVar22 + 0xa4) * fVar7 + *(float *)(uVar22 + 0xd4);
          fVar91 = *(float *)(uVar22 + 0x48) * fVar5 +
                   *(float *)(uVar22 + 0x78) * fVar6 +
                   *(float *)(uVar22 + 0xa8) * fVar7 + *(float *)(uVar22 + 0xd8);
          fVar92 = *(float *)(uVar22 + 0x4c) * fVar5 +
                   *(float *)(uVar22 + 0x7c) * fVar6 +
                   *(float *)(uVar22 + 0xac) * fVar7 + *(float *)(uVar22 + 0xdc);
          auVar56._4_4_ = iVar15;
          auVar56._0_4_ = iVar15;
          auVar56._8_4_ = iVar15;
          auVar56._12_4_ = iVar15;
          fVar73 = ((*(float *)(uVar22 + 0xe0) * fVar16 + fVar68) - fVar81) * fVar77;
          fVar74 = ((*(float *)(uVar22 + 0xe4) * fVar16 + fVar68) - fVar82) * fVar80;
          fVar75 = ((*(float *)(uVar22 + 0xe8) * fVar16 + fVar68) - fVar83) * fVar65;
          fVar76 = ((*(float *)(uVar22 + 0xec) * fVar16 + fVar68) - fVar84) * fVar66;
          fVar77 = ((*(float *)(uVar22 + 0x110) * fVar16 + fVar67) - fVar81) * fVar77;
          fVar80 = ((*(float *)(uVar22 + 0x114) * fVar16 + fVar67) - fVar82) * fVar80;
          fVar65 = ((*(float *)(uVar22 + 0x118) * fVar16 + fVar67) - fVar83) * fVar65;
          fVar66 = ((*(float *)(uVar22 + 0x11c) * fVar16 + fVar67) - fVar84) * fVar66;
          fVar81 = ((*(float *)(uVar22 + 0xf0) * fVar16 + fVar68) - fVar85) * fVar78;
          fVar82 = ((*(float *)(uVar22 + 0xf4) * fVar16 + fVar68) - fVar86) * fVar60;
          fVar83 = ((*(float *)(uVar22 + 0xf8) * fVar16 + fVar68) - fVar87) * fVar61;
          fVar84 = ((*(float *)(uVar22 + 0xfc) * fVar16 + fVar68) - fVar88) * fVar62;
          fVar69 = ((fVar68 + *(float *)(uVar22 + 0x100) * fVar16) - fVar89) * fVar79;
          fVar70 = ((fVar68 + *(float *)(uVar22 + 0x104) * fVar16) - fVar90) * fVar40;
          fVar71 = ((fVar68 + *(float *)(uVar22 + 0x108) * fVar16) - fVar91) * fVar41;
          fVar68 = ((fVar68 + *(float *)(uVar22 + 0x10c) * fVar16) - fVar92) * fVar42;
          fVar78 = ((*(float *)(uVar22 + 0x120) * fVar16 + fVar67) - fVar85) * fVar78;
          fVar60 = ((*(float *)(uVar22 + 0x124) * fVar16 + fVar67) - fVar86) * fVar60;
          fVar61 = ((*(float *)(uVar22 + 0x128) * fVar16 + fVar67) - fVar87) * fVar61;
          fVar62 = ((*(float *)(uVar22 + 300) * fVar16 + fVar67) - fVar88) * fVar62;
          fVar79 = ((fVar16 * *(float *)(uVar22 + 0x130) + fVar67) - fVar89) * fVar79;
          fVar40 = ((fVar16 * *(float *)(uVar22 + 0x134) + fVar67) - fVar90) * fVar40;
          fVar41 = ((fVar16 * *(float *)(uVar22 + 0x138) + fVar67) - fVar91) * fVar41;
          fVar42 = ((fVar16 * *(float *)(uVar22 + 0x13c) + fVar67) - fVar92) * fVar42;
          auVar39._0_4_ =
               (uint)((int)fVar78 < (int)fVar81) * (int)fVar78 |
               (uint)((int)fVar78 >= (int)fVar81) * (int)fVar81;
          auVar39._4_4_ =
               (uint)((int)fVar60 < (int)fVar82) * (int)fVar60 |
               (uint)((int)fVar60 >= (int)fVar82) * (int)fVar82;
          auVar39._8_4_ =
               (uint)((int)fVar61 < (int)fVar83) * (int)fVar61 |
               (uint)((int)fVar61 >= (int)fVar83) * (int)fVar83;
          auVar39._12_4_ =
               (uint)((int)fVar62 < (int)fVar84) * (int)fVar62 |
               (uint)((int)fVar62 >= (int)fVar84) * (int)fVar84;
          auVar49._0_4_ =
               (uint)((int)fVar79 < (int)fVar69) * (int)fVar79 |
               (uint)((int)fVar79 >= (int)fVar69) * (int)fVar69;
          auVar49._4_4_ =
               (uint)((int)fVar40 < (int)fVar70) * (int)fVar40 |
               (uint)((int)fVar40 >= (int)fVar70) * (int)fVar70;
          auVar49._8_4_ =
               (uint)((int)fVar41 < (int)fVar71) * (int)fVar41 |
               (uint)((int)fVar41 >= (int)fVar71) * (int)fVar71;
          auVar49._12_4_ =
               (uint)((int)fVar42 < (int)fVar68) * (int)fVar42 |
               (uint)((int)fVar42 >= (int)fVar68) * (int)fVar68;
          auVar46 = maxps(auVar39,auVar49);
          auVar50._0_4_ =
               (uint)((int)fVar77 < (int)fVar73) * (int)fVar77 |
               (uint)((int)fVar77 >= (int)fVar73) * (int)fVar73;
          auVar50._4_4_ =
               (uint)((int)fVar80 < (int)fVar74) * (int)fVar80 |
               (uint)((int)fVar80 >= (int)fVar74) * (int)fVar74;
          auVar50._8_4_ =
               (uint)((int)fVar65 < (int)fVar75) * (int)fVar65 |
               (uint)((int)fVar65 >= (int)fVar75) * (int)fVar75;
          auVar50._12_4_ =
               (uint)((int)fVar66 < (int)fVar76) * (int)fVar66 |
               (uint)((int)fVar66 >= (int)fVar76) * (int)fVar76;
          auVar64._4_4_ = iVar14;
          auVar64._0_4_ = iVar14;
          auVar64._8_4_ = iVar14;
          auVar64._12_4_ = iVar14;
          auVar72._0_4_ =
               (uint)((int)fVar78 < (int)fVar81) * (int)fVar81 |
               (uint)((int)fVar78 >= (int)fVar81) * (int)fVar78;
          auVar72._4_4_ =
               (uint)((int)fVar60 < (int)fVar82) * (int)fVar82 |
               (uint)((int)fVar60 >= (int)fVar82) * (int)fVar60;
          auVar72._8_4_ =
               (uint)((int)fVar61 < (int)fVar83) * (int)fVar83 |
               (uint)((int)fVar61 >= (int)fVar83) * (int)fVar61;
          auVar72._12_4_ =
               (uint)((int)fVar62 < (int)fVar84) * (int)fVar84 |
               (uint)((int)fVar62 >= (int)fVar84) * (int)fVar62;
          auVar43._0_4_ =
               (uint)((int)fVar79 < (int)fVar69) * (int)fVar69 |
               (uint)((int)fVar79 >= (int)fVar69) * (int)fVar79;
          auVar43._4_4_ =
               (uint)((int)fVar40 < (int)fVar70) * (int)fVar70 |
               (uint)((int)fVar40 >= (int)fVar70) * (int)fVar40;
          auVar43._8_4_ =
               (uint)((int)fVar41 < (int)fVar71) * (int)fVar71 |
               (uint)((int)fVar41 >= (int)fVar71) * (int)fVar41;
          auVar43._12_4_ =
               (uint)((int)fVar42 < (int)fVar68) * (int)fVar68 |
               (uint)((int)fVar42 >= (int)fVar68) * (int)fVar42;
          auVar59 = minps(auVar72,auVar43);
          auVar64 = maxps(auVar64,auVar50);
          auVar64 = maxps(auVar64,auVar46);
          auVar46._4_4_ =
               (uint)((int)fVar80 < (int)fVar74) * (int)fVar74 |
               (uint)((int)fVar80 >= (int)fVar74) * (int)fVar80;
          auVar46._0_4_ =
               (uint)((int)fVar77 < (int)fVar73) * (int)fVar73 |
               (uint)((int)fVar77 >= (int)fVar73) * (int)fVar77;
          auVar46._8_4_ =
               (uint)((int)fVar65 < (int)fVar75) * (int)fVar75 |
               (uint)((int)fVar65 >= (int)fVar75) * (int)fVar65;
          auVar46._12_4_ =
               (uint)((int)fVar66 < (int)fVar76) * (int)fVar76 |
               (uint)((int)fVar66 >= (int)fVar76) * (int)fVar66;
          auVar46 = minps(auVar56,auVar46);
          auVar46 = minps(auVar46,auVar59);
          auVar44._4_4_ = -(uint)(auVar64._4_4_ <= auVar46._4_4_);
          auVar44._0_4_ = -(uint)(auVar64._0_4_ <= auVar46._0_4_);
          auVar44._8_4_ = -(uint)(auVar64._8_4_ <= auVar46._8_4_);
          auVar44._12_4_ = -(uint)(auVar64._12_4_ <= auVar46._12_4_);
          uVar27 = movmskps((int)unaff_RBP,auVar44);
          unaff_RBP = CONCAT44(uVar28,uVar27);
        }
        else {
          pfVar3 = (float *)(uVar22 + 0x80 + uVar33);
          pfVar1 = (float *)(uVar22 + 0x20 + uVar33);
          pfVar4 = (float *)(uVar22 + 0x80 + uVar26);
          pfVar2 = (float *)(uVar22 + 0x20 + uVar26);
          auVar35._0_4_ = ((*pfVar3 * fVar16 + *pfVar1) - fVar5) * fVar11;
          auVar35._4_4_ = ((pfVar3[1] * fVar16 + pfVar1[1]) - fVar5) * fVar11;
          auVar35._8_4_ = ((pfVar3[2] * fVar16 + pfVar1[2]) - fVar5) * fVar11;
          auVar35._12_4_ = ((pfVar3[3] * fVar16 + pfVar1[3]) - fVar5) * fVar11;
          auVar45._0_4_ = ((*pfVar4 * fVar16 + *pfVar2) - fVar6) * fVar12;
          auVar45._4_4_ = ((pfVar4[1] * fVar16 + pfVar2[1]) - fVar6) * fVar12;
          auVar45._8_4_ = ((pfVar4[2] * fVar16 + pfVar2[2]) - fVar6) * fVar12;
          auVar45._12_4_ = ((pfVar4[3] * fVar16 + pfVar2[3]) - fVar6) * fVar12;
          pfVar2 = (float *)(uVar22 + 0x80 + uVar34);
          pfVar1 = (float *)(uVar22 + 0x20 + uVar34);
          auVar51._0_4_ = ((*pfVar2 * fVar16 + *pfVar1) - fVar7) * fVar13;
          auVar51._4_4_ = ((pfVar2[1] * fVar16 + pfVar1[1]) - fVar7) * fVar13;
          auVar51._8_4_ = ((pfVar2[2] * fVar16 + pfVar1[2]) - fVar7) * fVar13;
          auVar51._12_4_ = ((pfVar2[3] * fVar16 + pfVar1[3]) - fVar7) * fVar13;
          auVar46 = maxps(auVar45,auVar51);
          pfVar2 = (float *)(uVar22 + 0x80 + (uVar33 ^ 0x10));
          pfVar1 = (float *)(uVar22 + 0x20 + (uVar33 ^ 0x10));
          auVar52._0_4_ = ((*pfVar2 * fVar16 + *pfVar1) - fVar5) * fVar11;
          auVar52._4_4_ = ((pfVar2[1] * fVar16 + pfVar1[1]) - fVar5) * fVar11;
          auVar52._8_4_ = ((pfVar2[2] * fVar16 + pfVar1[2]) - fVar5) * fVar11;
          auVar52._12_4_ = ((pfVar2[3] * fVar16 + pfVar1[3]) - fVar5) * fVar11;
          pfVar2 = (float *)(uVar22 + 0x80 + (uVar26 ^ 0x10));
          pfVar1 = (float *)(uVar22 + 0x20 + (uVar26 ^ 0x10));
          auVar63._0_4_ = ((*pfVar2 * fVar16 + *pfVar1) - fVar6) * fVar12;
          auVar63._4_4_ = ((pfVar2[1] * fVar16 + pfVar1[1]) - fVar6) * fVar12;
          auVar63._8_4_ = ((pfVar2[2] * fVar16 + pfVar1[2]) - fVar6) * fVar12;
          auVar63._12_4_ = ((pfVar2[3] * fVar16 + pfVar1[3]) - fVar6) * fVar12;
          pfVar2 = (float *)(uVar22 + 0x80 + (uVar34 ^ 0x10));
          pfVar1 = (float *)(uVar22 + 0x20 + (uVar34 ^ 0x10));
          auVar54._0_4_ = ((*pfVar2 * fVar16 + *pfVar1) - fVar7) * fVar13;
          auVar54._4_4_ = ((pfVar2[1] * fVar16 + pfVar1[1]) - fVar7) * fVar13;
          auVar54._8_4_ = ((pfVar2[2] * fVar16 + pfVar1[2]) - fVar7) * fVar13;
          auVar54._12_4_ = ((pfVar2[3] * fVar16 + pfVar1[3]) - fVar7) * fVar13;
          auVar64 = minps(auVar63,auVar54);
          auVar55._4_4_ = iVar14;
          auVar55._0_4_ = iVar14;
          auVar55._8_4_ = iVar14;
          auVar55._12_4_ = iVar14;
          auVar56 = maxps(auVar55,auVar35);
          auVar56 = maxps(auVar56,auVar46);
          auVar36._4_4_ = iVar15;
          auVar36._0_4_ = iVar15;
          auVar36._8_4_ = iVar15;
          auVar36._12_4_ = iVar15;
          auVar46 = minps(auVar36,auVar52);
          auVar46 = minps(auVar46,auVar64);
          bVar17 = auVar56._0_4_ <= auVar46._0_4_;
          bVar18 = auVar56._4_4_ <= auVar46._4_4_;
          bVar19 = auVar56._8_4_ <= auVar46._8_4_;
          bVar20 = auVar56._12_4_ <= auVar46._12_4_;
          if (uVar24 == 6) {
            bVar17 = (fVar16 < *(float *)(uVar22 + 0xf0) && *(float *)(uVar22 + 0xe0) <= fVar16) &&
                     bVar17;
            bVar18 = (fVar16 < *(float *)(uVar22 + 0xf4) && *(float *)(uVar22 + 0xe4) <= fVar16) &&
                     bVar18;
            bVar19 = (fVar16 < *(float *)(uVar22 + 0xf8) && *(float *)(uVar22 + 0xe8) <= fVar16) &&
                     bVar19;
            bVar20 = (fVar16 < *(float *)(uVar22 + 0xfc) && *(float *)(uVar22 + 0xec) <= fVar16) &&
                     bVar20;
          }
          auVar57._0_4_ = (uint)bVar17 * -0x80000000;
          auVar57._4_4_ = (uint)bVar18 * -0x80000000;
          auVar57._8_4_ = (uint)bVar19 * -0x80000000;
          auVar57._12_4_ = (uint)bVar20 * -0x80000000;
          uVar27 = movmskps((int)unaff_RBP,auVar57);
          unaff_RBP = CONCAT44(uVar28,uVar27);
        }
      }
      if ((sVar30 & 8) == 0) {
        if (unaff_RBP == 0) {
          uVar24 = 4;
        }
        else {
          uVar22 = sVar30 & 0xfffffffffffffff0;
          lVar25 = 0;
          if (unaff_RBP != 0) {
            for (; (unaff_RBP >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
            }
          }
          uVar24 = 0;
          sVar30 = *(size_t *)(uVar22 + lVar25 * 8);
          uVar29 = unaff_RBP - 1 & unaff_RBP;
          if (uVar29 != 0) {
            pNVar32->ptr = sVar30;
            lVar25 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
              }
            }
            uVar23 = uVar29 - 1;
            while( true ) {
              pNVar32 = pNVar32 + 1;
              sVar30 = *(size_t *)(uVar22 + lVar25 * 8);
              uVar23 = uVar23 & uVar29;
              if (uVar23 == 0) break;
              pNVar32->ptr = sVar30;
              lVar25 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
                }
              }
              uVar29 = uVar23 - 1;
            }
          }
        }
      }
      else {
        uVar24 = 6;
      }
    } while (uVar24 == 0);
    if (uVar24 == 6) {
      cVar21 = (**(code **)((long)This->leafIntersector +
                           (ulong)*(byte *)(sVar30 & 0xfffffffffffffff0) * 0x40 + 0x18))(pre,ray,k);
      uVar24 = 0;
      if (cVar21 != '\0') {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        uVar24 = 1;
      }
    }
  } while ((uVar24 & 3) == 0);
  return pNVar31 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }